

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

void __thiscall
FIX::ServerWrapper::onEvent(ServerWrapper *this,SocketMonitor *monitor,socket_handle socket)

{
  _Rb_tree_header *__addr;
  SocketServer *this_00;
  Strategy *pSVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  _Base_ptr __addr_len;
  
  p_Var4 = (this->m_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    __addr = &(this->m_sockets)._M_t._M_impl.super__Rb_tree_header;
    __addr_len = &__addr->_M_header;
    do {
      if (socket <= (int)p_Var4[1]._M_color) {
        __addr_len = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < socket];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__addr_len != __addr) && ((int)__addr_len[1]._M_color <= socket)) {
      this_00 = this->m_server;
      pSVar1 = this->m_strategy;
      uVar3 = SocketServer::accept(this_00,socket,(sockaddr *)__addr,&__addr_len->_M_color);
      UNRECOVERED_JUMPTABLE = pSVar1->_vptr_Strategy[2];
      (*UNRECOVERED_JUMPTABLE)
                (pSVar1,this_00,(ulong)(uint)socket,(ulong)uVar3,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  iVar2 = (*this->m_strategy->_vptr_Strategy[4])
                    (this->m_strategy,this->m_server,(ulong)(uint)socket);
  if ((char)iVar2 != '\0') {
    return;
  }
  (*(this->super_Strategy)._vptr_Strategy[5])(this,monitor,(ulong)(uint)socket);
  return;
}

Assistant:

void onEvent( SocketMonitor& monitor, socket_handle socket )
  {
    if( m_sockets.find(socket) != m_sockets.end() )
    {
      m_strategy.onConnect( m_server, socket, m_server.accept(socket) );
    }
    else
    {
      if( !m_strategy.onData( m_server, socket ) )
        onError( monitor, socket );
    }
  }